

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::IFF_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IFF_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pKVar3;
  KStringStream ss;
  KString local_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2b8,&this->super_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-IFF/ATC/NAVAIDS Layer 1 PDU-\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Emitting Entity ID:\n",0x14);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_218,&local_1d8,Tabs,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EventID);
  UTILS::IndentString(&local_238,&local_1f8,Tabs_00,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Location:    ",0xd);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_258,&this->m_Location);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_258._M_dataplus._M_p,local_258._M_string_length);
  DATA_TYPE::SystemIdentifier::GetAsString_abi_cxx11_(&local_278,&this->m_SystemID);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_278._M_dataplus._M_p,local_278._M_string_length);
  DATA_TYPE::FundamentalOperationalData::GetAsString_abi_cxx11_(&local_298,&this->m_FOD);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"System Designator:    ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"System Specific Data: ",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pKVar1 = (this->m_vLayers).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vLayers).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-IFF/ATC/NAVAIDS Layer 1 PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Location:    " << m_Location.GetAsString()
       << m_SystemID.GetAsString()
       << m_FOD.GetAsString();

	#if DIS_VERSION > 6

	ss << "System Designator:    " << ( KUINT16 )m_ui8SystemDesignator << "\n"
	   << "System Specific Data: " << ( KUINT16 )m_ui8SystemSpecific << "\n";

	#endif

	vector<LyrHdrPtr>::const_iterator citr = m_vLayers.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = m_vLayers.end();
	for( ; citr != citrEnd; ++citr )
	{
		ss << ( *citr )->GetAsString();
	}

    return ss.str();	
}